

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

QCGroup * __thiscall
obx::anon_unknown_3::QCGroup::copyThisAndPush
          (QCGroup *__return_storage_ptr__,QCGroup *this,QueryCondition *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  pointer psVar5;
  pointer psVar6;
  QCGroup *pQVar7;
  ulong uVar8;
  pointer psVar9;
  QCGroup *extraout_RAX;
  QCGroup *extraout_RAX_00;
  undefined4 extraout_var;
  ulong uVar10;
  pointer psVar11;
  pointer psVar12;
  unique_ptr<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
  *__r;
  _Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  *this_00;
  long lVar13;
  shared_ptr<obx::(anonymous_namespace)::QueryCondition> *__cur;
  shared_ptr<obx::(anonymous_namespace)::QueryCondition> local_48;
  unique_ptr<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
  local_38;
  
  (__return_storage_ptr__->super_QueryCondition)._vptr_QueryCondition =
       (_func_int **)&PTR__QCGroup_00112988;
  __return_storage_ptr__->isOr_ = this->isOr_;
  lVar13 = (long)(this->conditions_).
                 super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->conditions_).
                 super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = std::
           _Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ::_M_allocate((_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                          *)(lVar13 >> 4),(size_t)this);
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar5;
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar5;
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar13 + (long)psVar5);
  psVar11 = (this->conditions_).
            super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->conditions_).
                super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar11; psVar6 = psVar6 + 1) {
    p_Var1 = (psVar6->
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    (psVar5->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = (psVar6->
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    (psVar5->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    psVar5 = psVar5 + 1;
  }
  (__return_storage_ptr__->conditions_).
  super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar5;
  (*other->_vptr_QueryCondition[5])(&local_38,other);
  __r = &local_38;
  std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>::
  shared_ptr<obx::(anonymous_namespace)::QueryCondition,std::default_delete<obx::(anonymous_namespace)::QueryCondition>,void>
            (&local_48,__r);
  _Var3._M_pi = local_48.
                super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (psVar5 == (__return_storage_ptr__->conditions_).
                super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    psVar6 = (__return_storage_ptr__->conditions_).
             super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)psVar5 - (long)psVar6;
    if (lVar13 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar8 = lVar13 >> 4;
    uVar10 = 1;
    if (psVar5 != psVar6) {
      uVar10 = uVar8;
    }
    this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
               *)(uVar10 + uVar8);
    if ((_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
         *)0x7fffffffffffffe < this_00) {
      this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 *)0x7ffffffffffffff;
    }
    if (CARRY8(uVar10,uVar8)) {
      this_00 = (_Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                 *)0x7ffffffffffffff;
    }
    psVar9 = std::
             _Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
             ::_M_allocate(this_00,(size_t)__r);
    _Var3._M_pi = local_48.
                  super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)((long)psVar9 + lVar13) =
         local_48.
         super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    ((undefined8 *)((long)psVar9 + lVar13))[1] = _Var3._M_pi;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    psVar12 = psVar9;
    for (psVar11 = psVar6; psVar5 != psVar11; psVar11 = psVar11 + 1) {
      peVar2 = (psVar11->
               super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var1 = (psVar11->
               super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar11->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar12->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = peVar2;
      (psVar12->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = p_Var1;
      (psVar11->
      super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)0x0;
      psVar12 = psVar12 + 1;
    }
    pQVar7 = (QCGroup *)0x0;
    if (psVar6 != (pointer)0x0) {
      operator_delete(psVar6);
      pQVar7 = extraout_RAX;
    }
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar9;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar12 + 1;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar9 + (long)this_00;
    if (local_48.
        super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      pQVar7 = extraout_RAX_00;
    }
  }
  else {
    pQVar7 = (QCGroup *)0x0;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (psVar5->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = local_48.
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (psVar5->
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = _Var3._M_pi;
    local_48.
    super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->conditions_).
    super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar5 + 1;
  }
  if ((tuple<obx::(anonymous_namespace)::QueryCondition_*,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
       )local_38._M_t.
        super___uniq_ptr_impl<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
        ._M_t.
        super__Tuple_impl<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
        .super__Head_base<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_false>._M_head_impl !=
      (_Head_base<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_false>)0x0) {
    iVar4 = (*(*(_func_int ***)
                local_38._M_t.
                super___uniq_ptr_impl<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
                ._M_t.
                super__Tuple_impl<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
                .super__Head_base<0UL,_obx::(anonymous_namespace)::QueryCondition_*,_false>.
                _M_head_impl)[1])();
    pQVar7 = (QCGroup *)CONCAT44(extraout_var,iVar4);
  }
  return pQVar7;
}

Assistant:

QCGroup copyThisAndPush(const QueryCondition& other) {
        QCGroup copy(*this);
        copy.conditions_.push_back(internalCopyAsPtr(other));
        return copy;
    }